

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

exr_result_t
validate_channels(_internal_exr_context *f,_internal_exr_part *curpart,exr_attr_chlist_t *channels)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  exr_attr_chlist_entry_t *peVar4;
  bool bVar5;
  uint uVar6;
  exr_result_t eVar7;
  ulong uVar8;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  if (channels == (exr_attr_chlist_t *)0x0) {
    UNRECOVERED_JUMPTABLE = f->report_error;
    pcVar12 = "Missing required channels attribute to validate against";
    eVar7 = 3;
  }
  else if (curpart->dataWindow == (exr_attribute_t *)0x0) {
    UNRECOVERED_JUMPTABLE = f->report_error;
    pcVar12 = "request to validate channel list, but data window not set to validate against";
    eVar7 = 0xf;
  }
  else {
    if (0 < channels->num_channels) {
      if (0 < channels->num_channels) {
        uVar1 = (curpart->data_window).min.field_0.field_0.x;
        iVar2 = (curpart->data_window).min.field_0.field_0.y;
        uVar8 = ((long)(curpart->data_window).max.field_0.field_0.x - (long)(int)uVar1) + 1;
        uVar9 = ((long)(curpart->data_window).max.field_0.field_0.y - (long)iVar2) + 1;
        lVar13 = 8;
        lVar15 = 0;
        uVar10 = uVar9;
        do {
          peVar4 = channels->entries;
          uVar6 = *(uint *)(peVar4->reserved + lVar13 + -5);
          if ((long)(int)uVar6 < 1) {
            uVar11 = *(undefined8 *)(peVar4->reserved + lVar13 + -0x15);
            pcVar12 = "channel \'%s\': x subsampling factor is invalid (%d)";
LAB_0012a241:
            uVar6 = (*f->print_error)(f,0xe,pcVar12,uVar11,(ulong)uVar6);
LAB_0012a26e:
            bVar5 = false;
            uVar10 = (ulong)uVar6;
          }
          else {
            uVar3 = *(uint *)(peVar4->reserved + lVar13 + -1);
            uVar14 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              uVar11 = *(undefined8 *)(peVar4->reserved + lVar13 + -0x15);
              pcVar12 = "channel \'%s\': y subsampling factor is invalid (%d)";
              uVar6 = uVar3;
              goto LAB_0012a241;
            }
            if ((int)uVar1 % (int)uVar6 != 0) {
              uVar11 = *(undefined8 *)(peVar4->reserved + lVar13 + -0x15);
              pcVar12 = 
              "channel \'%s\': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)"
              ;
              uVar14 = (ulong)uVar6;
              uVar10 = (ulong)uVar1;
LAB_0012a269:
              uVar6 = (*f->print_error)(f,0xe,pcVar12,uVar11,uVar10,uVar14);
              goto LAB_0012a26e;
            }
            if (iVar2 % (int)uVar3 != 0) {
              uVar11 = *(undefined8 *)(peVar4->reserved + lVar13 + -0x15);
              pcVar12 = 
              "channel \'%s\': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)"
              ;
              uVar10 = (long)iVar2;
              goto LAB_0012a269;
            }
            if ((long)uVar8 % (long)(int)uVar6 != 0) {
              uVar11 = *(undefined8 *)(peVar4->reserved + lVar13 + -0x15);
              pcVar12 = 
              "channel \'%s\': row width (%ld) of the data window is not a multiple of the x subsampling factor (%d)"
              ;
              uVar14 = (ulong)uVar6;
              uVar10 = uVar8;
LAB_0012a2ed:
              uVar6 = (*f->print_error)(f,0xe,pcVar12,uVar11,uVar10,uVar14);
              goto LAB_0012a26e;
            }
            if ((long)uVar9 % (long)uVar14 != 0) {
              uVar11 = *(undefined8 *)(peVar4->reserved + lVar13 + -0x15);
              pcVar12 = 
              "channel \'%s\': column height (%ld) of the data window is not a multiple of the y subsampling factor (%d)"
              ;
              uVar10 = uVar9;
              goto LAB_0012a2ed;
            }
            bVar5 = true;
          }
          if (!bVar5) {
            return (exr_result_t)uVar10;
          }
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 0x20;
        } while (lVar15 < channels->num_channels);
      }
      return 0;
    }
    UNRECOVERED_JUMPTABLE = f->report_error;
    pcVar12 = "At least one channel required";
    eVar7 = 6;
  }
  eVar7 = (*UNRECOVERED_JUMPTABLE)(f,eVar7,pcVar12);
  return eVar7;
}

Assistant:

static exr_result_t
validate_channels (
    struct _internal_exr_context* f,
    struct _internal_exr_part*    curpart,
    const exr_attr_chlist_t*      channels)
{
    exr_attr_box2i_t dw;
    int64_t          w, h;

    if (!channels)
        return f->report_error (
            f,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing required channels attribute to validate against");
    if (!curpart->dataWindow)
        return f->report_error (
            f,
            EXR_ERR_NO_ATTR_BY_NAME,
            "request to validate channel list, but data window not set to validate against");

    if (channels->num_channels <= 0)
        return f->report_error (
            f, EXR_ERR_FILE_BAD_HEADER, "At least one channel required");

    dw = curpart->data_window;
    w  = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h  = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    for (int c = 0; c < channels->num_channels; ++c)
    {
        int32_t xsamp = channels->entries[c].x_sampling;
        int32_t ysamp = channels->entries[c].y_sampling;

        if (xsamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': x subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                xsamp);
        if (ysamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': y subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                ysamp);
        if (dw.min.x % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.x,
                xsamp);
        if (dw.min.y % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.y,
                ysamp);
        if (w % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': row width (%" PRId64
                ") of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                w,
                xsamp);
        if (h % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': column height (%" PRId64
                ") of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                h,
                ysamp);
    }

    return EXR_ERR_SUCCESS;
}